

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
nestl::has_exceptions::list<int,_nestl::allocator<int>_>::list
          (list<int,_nestl::allocator<int>_> *this,list<int,_nestl::allocator<int>_> *other)

{
  list_node_base *plVar1;
  bool bVar2;
  default_operation_error err;
  exception_ptr local_20;
  exception_ptr local_18;
  
  plVar1 = &(this->super_list<int,_nestl::allocator<int>_>).m_node;
  (this->super_list<int,_nestl::allocator<int>_>).m_node.m_next = plVar1;
  (this->super_list<int,_nestl::allocator<int>_>).m_node.m_prev = plVar1;
  local_20._M_exception_object = (void *)0x0;
  impl::list<int,_nestl::allocator<int>_>::copy_nothrow<nestl::has_exceptions::exception_ptr_error>
            (&this->super_list<int,_nestl::allocator<int>_>,(exception_ptr_error *)&local_20,
             &other->super_list<int,_nestl::allocator<int>_>);
  bVar2 = exception_ptr_error::operator_cast_to_bool((exception_ptr_error *)&local_20);
  if (bVar2) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,&local_20);
    throw_exception((exception_ptr_error *)&local_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
  }
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
  return;
}

Assistant:

list(const list& other)
    {
        default_operation_error err;
        this->copy_nothrow(err, other);
        if (err)
        {
            throw_exception(err);
        }
    }